

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QHash<QString,QString>::key_iterator>
          (QCommonArrayOps<QString> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QString,_QString>::key_iterator> param_3)

{
  qsizetype *pqVar1;
  Entry *pEVar2;
  Data *pDVar3;
  QString *pQVar4;
  ulong uVar5;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar6;
  ulong uVar7;
  
  uVar5 = b.i.i.bucket;
  pDVar6 = b.i.i.d;
  if (uVar5 != e.i.i.bucket || pDVar6 != e.i.i.d) {
    pQVar4 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
             + (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
               size;
    do {
      pEVar2 = pDVar6->spans[uVar5 >> 7].entries;
      uVar7 = (ulong)((uint)pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] * 0x30);
      pDVar3 = *(Data **)((pEVar2->storage).data + uVar7);
      (pQVar4->d).d = pDVar3;
      (pQVar4->d).ptr = *(char16_t **)((pEVar2->storage).data + uVar7 + 8);
      (pQVar4->d).size = *(qsizetype *)((pEVar2->storage).data + uVar7 + 0x10);
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pqVar1 = &(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
                size;
      *pqVar1 = *pqVar1 + 1;
      pQVar4 = pQVar4 + 1;
      do {
        if (pDVar6->numBuckets - 1 == uVar5) {
          pDVar6 = (Data<QHashPrivate::Node<QString,_QString>_> *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while (uVar5 != e.i.i.bucket || pDVar6 != e.i.i.d);
  }
  return;
}

Assistant:

bool operator==(iterator other) const noexcept
    { return d == other.d && bucket == other.bucket; }